

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeparser.cpp
# Opt level: O1

FieldInfo __thiscall QDateTimeParser::fieldInfo(QDateTimeParser *this,int index)

{
  Section SVar1;
  int *piVar2;
  long lVar3;
  SectionNode *pSVar4;
  ushort *puVar5;
  QFlagsStorage<QDateTimeParser::FieldInfoFlag> QVar6;
  QFlagsStorage<QDateTimeParser::FieldInfoFlag> QVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QMessageLogger local_60;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar4 = sectionNode(this,index);
  SVar1 = pSVar4->type;
  if ((int)SVar1 < 0x100) {
    if ((int)SVar1 < 0x10) {
      switch(SVar1) {
      case AmPmSection:
        getAmPmText((QString *)&local_60,this,AmText,pSVar4->count);
        lVar3 = CONCAT44(local_60.context.function._4_4_,local_60.context.function._0_4_);
        getAmPmText(&local_40,this,PmText,pSVar4->count);
        if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
          }
        }
        piVar2 = (int *)CONCAT44(local_60.context.line,local_60.context.version);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT44(local_60.context.line,local_60.context.version),2,0x10
                      );
          }
        }
        bVar8 = lVar3 == local_40.d.size;
LAB_00418d2c:
        QVar7.i = (uint)bVar8 * 2;
        goto LAB_00418d66;
      case MSecSection:
        QVar6.i = 0xd;
        break;
      default:
        goto switchD_00418c52_caseD_3;
      case SecondSection:
      case MinuteSection:
switchD_00418c52_caseD_4:
        QVar6.i = 5;
      }
LAB_00418d3a:
      QVar7.i = QVar6.i | 2;
      if (pSVar4->count == 1) {
        QVar7.i = QVar6.i;
      }
      goto LAB_00418d66;
    }
    if ((SVar1 == Hour12Section) || (SVar1 == Hour24Section)) goto switchD_00418c52_caseD_4;
    QVar7.i = 0;
    if (SVar1 == TimeZoneSection) goto LAB_00418d66;
  }
  else if ((int)SVar1 < 0x800) {
    if ((SVar1 == DaySection) || (SVar1 == MonthSection)) {
      QVar7.i = 7;
      if (pSVar4->count != 2) {
        QVar7.i = (uint)(pSVar4->count == 1) * 5;
      }
      goto LAB_00418d66;
    }
    QVar6.i = 1;
    if (SVar1 == YearSection) goto LAB_00418d3a;
  }
  else {
    if (SVar1 == YearSection2Digits) goto switchD_00418c52_caseD_4;
    if ((SVar1 == DayOfWeekSectionShort) || (SVar1 == DayOfWeekSectionLong)) {
      bVar8 = pSVar4->count == 3;
      goto LAB_00418d2c;
    }
  }
switchD_00418c52_caseD_3:
  local_60.context.version = 2;
  local_60.context.line = 0;
  local_60.context.file._0_4_ = 0;
  local_60.context.file._4_4_ = 0;
  local_60.context.function._0_4_ = 0;
  local_60.context.function._4_4_ = 0;
  local_60.context.category = "default";
  SectionNode::name(&local_40,pSVar4->type);
  puVar5 = QString::utf16(&local_40);
  QMessageLogger::warning
            (&local_60,"QDateTimeParser::fieldInfo Internal error 2 (%d %ls %d)",index,puVar5,
             (ulong)(uint)pSVar4->count);
  fieldInfo();
  QVar7.i = 0;
LAB_00418d66:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QFlagsStorageHelper<QDateTimeParser::FieldInfoFlag,_4>)
           (QFlagsStorageHelper<QDateTimeParser::FieldInfoFlag,_4>)QVar7.i;
  }
  __stack_chk_fail();
}

Assistant:

QDateTimeParser::FieldInfo QDateTimeParser::fieldInfo(int index) const
{
    FieldInfo ret;
    const SectionNode &sn = sectionNode(index);
    switch (sn.type) {
    case MSecSection:
        ret |= Fraction;
        Q_FALLTHROUGH();
    case SecondSection:
    case MinuteSection:
    case Hour24Section:
    case Hour12Section:
    case YearSection2Digits:
        ret |= AllowPartial;
        Q_FALLTHROUGH();
    case YearSection:
        ret |= Numeric;
        if (sn.count != 1)
            ret |= FixedWidth;
        break;
    case MonthSection:
    case DaySection:
        switch (sn.count) {
        case 2:
            ret |= FixedWidth;
            Q_FALLTHROUGH();
        case 1:
            ret |= (Numeric|AllowPartial);
            break;
        }
        break;
    case DayOfWeekSectionShort:
    case DayOfWeekSectionLong:
        if (sn.count == 3)
            ret |= FixedWidth;
        break;
    case AmPmSection:
        // Some locales have different length AM and PM texts.
        if (getAmPmText(AmText, Case(sn.count)).size()
            == getAmPmText(PmText, Case(sn.count)).size()) {
            // Only relevant to DateTimeEdit's fixups in parse().
            ret |= FixedWidth;
        }
        break;
    case TimeZoneSection:
        break;
    default:
        qWarning("QDateTimeParser::fieldInfo Internal error 2 (%d %ls %d)",
                 index, qUtf16Printable(sn.name()), sn.count);
        break;
    }
    return ret;
}